

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::CWriter::MangleName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name)

{
  CWriter CVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Z_",(allocator *)&local_50);
  if (name.data_ != (char *)0x0) {
    for (pcVar4 = (char *)0x0; name.data_ != pcVar4; pcVar4 = pcVar4 + 1) {
      CVar1 = this[(long)pcVar4];
      iVar3 = (int)(char)CVar1;
      iVar2 = isalnum(iVar3);
      if ((iVar3 == 0x5f) || (iVar3 != 0x5a && iVar2 != 0)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        StringPrintf_abi_cxx11_(&local_50,"%02X",(ulong)(byte)CVar1);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::_M_dispose();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::MangleName(string_view name) {
  const char kPrefix = 'Z';
  std::string result = "Z_";

  if (!name.empty()) {
    for (char c : name) {
      if ((isalnum(c) && c != kPrefix) || c == '_') {
        result += c;
      } else {
        result += kPrefix;
        result += StringPrintf("%02X", static_cast<uint8_t>(c));
      }
    }
  }

  return result;
}